

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

string * __thiscall
Kernel::getQuantifiedStr_abi_cxx11_
          (string *__return_storage_ptr__,Kernel *this,Unit *u,List<unsigned_int> *nonQuantified)

{
  undefined8 uVar1;
  Formula *f;
  bool bVar2;
  uint uVar3;
  undefined1 in_R9B;
  ulong uVar4;
  string res;
  Set<unsigned_int,_Lib::DefaultHash> vars;
  undefined1 local_170 [32];
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> t_map;
  string local_128;
  TermVarIterator vit;
  
  Lib::Set<unsigned_int,_Lib::DefaultHash>::Set(&vars);
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  t_map._timestamp = 1;
  t_map._size = 0;
  t_map._deleted = 0;
  t_map._capacityIndex = 0;
  t_map._capacity = 0;
  t_map._20_8_ = 0;
  t_map._28_8_ = 0;
  t_map._afterLast._4_4_ = 0;
  SortHelper::collectVariableSorts((Unit *)this,&t_map);
  if (((byte)this[4] & 1) == 0) {
    uVar1 = *(undefined8 *)(this + 0x38);
    for (uVar4 = 0; uVar4 != ((uint)uVar1 & 0xfffff); uVar4 = uVar4 + 1) {
      TermVarIterator::TermVarIterator(&vit,*(Term **)(this + uVar4 * 8 + 0x70));
      while( true ) {
        bVar2 = TermVarIterator::hasNext(&vit);
        if (!bVar2) break;
        uVar3 = TermVarIterator::next(&vit);
        bVar2 = Lib::List<unsigned_int>::member(uVar3,(List<unsigned_int> *)u);
        if (!bVar2) {
          Lib::Set<unsigned_int,_Lib::DefaultHash>::insert(&vars,uVar3);
        }
      }
      TermVarIterator::~TermVarIterator(&vit);
    }
    Clause::literalsOnlyToString_abi_cxx11_((string *)&vit,(Clause *)this);
    std::__cxx11::string::operator=((string *)&res,(string *)&vit);
    std::__cxx11::string::~string((string *)&vit);
  }
  else {
    f = *(Formula **)(this + 0x38);
    FormulaVarIterator::FormulaVarIterator((FormulaVarIterator *)&vit,f);
    while( true ) {
      bVar2 = FormulaVarIterator::hasNext((FormulaVarIterator *)&vit);
      if (!bVar2) break;
      uVar3 = FormulaVarIterator::next((FormulaVarIterator *)&vit);
      bVar2 = Lib::List<unsigned_int>::member(uVar3,(List<unsigned_int> *)u);
      if (!bVar2) {
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert(&vars,uVar3);
      }
    }
    Formula::toString_abi_cxx11_(&local_128,f);
    std::__cxx11::string::operator=((string *)&res,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    FormulaVarIterator::~FormulaVarIterator((FormulaVarIterator *)&vit);
  }
  std::__cxx11::string::string((string *)local_170,(string *)&res);
  getQuantifiedStr<Lib::Set<unsigned_int,Lib::DefaultHash>>
            (__return_storage_ptr__,(Kernel *)&vars,(Set<unsigned_int,_Lib::DefaultHash> *)local_170
             ,(string *)&t_map,
             (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x1,
             (bool)in_R9B);
  std::__cxx11::string::~string((string *)local_170);
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(&t_map);
  std::__cxx11::string::~string((string *)&res);
  Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set(&vars);
  return __return_storage_ptr__;
}

Assistant:

std::string getQuantifiedStr(Unit* u, List<unsigned>* nonQuantified=0)
{
  Set<unsigned> vars;
  std::string res;
  DHMap<unsigned,TermList> t_map;
  SortHelper::collectVariableSorts(u,t_map);
  if (u->isClause()) {
    Clause* cl=static_cast<Clause*>(u);
    unsigned clen=cl->length();
    for(unsigned i=0;i<clen;i++) {
      TermVarIterator vit( (*cl)[i] ); //TODO update iterator for two var lits?
      while(vit.hasNext()) {
        unsigned var=vit.next();
        if (List<unsigned>::member(var, nonQuantified)) {
          continue;
        }
        vars.insert(var);
      }
    }
    res=cl->literalsOnlyToString();
  } else {
    Formula* formula=static_cast<FormulaUnit*>(u)->formula();
    FormulaVarIterator fvit( formula );
    while(fvit.hasNext()) {
      unsigned var=fvit.next();
      if (List<unsigned>::member(var, nonQuantified)) {
        continue;
      }
      vars.insert(var);
    }
    res=formula->toString();
  }

  return getQuantifiedStr(vars, res, t_map);
}